

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O3

idx_t __thiscall duckdb::BoundLimitNode::GetConstantValue(BoundLimitNode *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == CONSTANT_VALUE) {
    return this->constant_integer;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "BoundLimitNode::GetConstantValue called but limit is not a constant value","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t BoundLimitNode::GetConstantValue() const {
	if (Type() != LimitNodeType::CONSTANT_VALUE) {
		throw InternalException("BoundLimitNode::GetConstantValue called but limit is not a constant value");
	}
	return constant_integer;
}